

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CGUIListBox.cpp
# Opt level: O0

void __thiscall irr::gui::CGUIListBox::draw(CGUIListBox *this)

{
  undefined8 *puVar1;
  byte bVar2;
  int iVar3;
  u32 uVar4;
  u32 uVar5;
  ulong uVar6;
  ListItem *pLVar7;
  long *in_RDI;
  position2di iconPos;
  rect<int> textRect;
  s32 i;
  bool hl;
  rect<int> clientClip;
  rect<int> frameRect;
  rect<int> *clipRect;
  IGUISkin *skin;
  rect<int> *c;
  undefined4 in_stack_fffffffffffffec0;
  undefined4 in_stack_fffffffffffffec4;
  undefined4 in_stack_fffffffffffffee0;
  u32 in_stack_fffffffffffffee4;
  undefined8 in_stack_fffffffffffffee8;
  long *plVar8;
  undefined4 in_stack_fffffffffffffef0;
  s32 sVar9;
  undefined4 in_stack_fffffffffffffef4;
  undefined4 uVar10;
  undefined4 in_stack_ffffffffffffff00;
  undefined4 in_stack_ffffffffffffff04;
  byte local_e9;
  undefined4 local_d4;
  undefined1 local_d0 [36];
  undefined4 local_ac;
  undefined1 local_a8 [32];
  undefined4 local_88;
  undefined4 local_84;
  vector2d<int> local_80;
  rect<int> local_78;
  undefined4 local_68;
  int local_64;
  byte local_5d;
  rect<int> local_5c;
  undefined4 local_4c;
  rect<int> local_48;
  rect<int> local_38;
  undefined8 local_28;
  vector2d<int> local_20;
  rect<int> *local_18;
  long *local_10;
  
  sVar9 = (s32)((ulong)in_stack_fffffffffffffee8 >> 0x20);
  if ((*(byte *)(in_RDI + 0x14) & 1) != 0) {
    recalculateItemHeight
              ((CGUIListBox *)CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00));
    local_10 = (long *)(**(code **)(*(long *)in_RDI[0x25] + 0x60))();
    (**(code **)(*local_10 + 0x10))(local_10,0);
    updateScrollBarSize((CGUIListBox *)CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0)
                        ,sVar9);
    local_18 = (rect<int> *)0x0;
    local_28 = in_RDI[8];
    local_20 = (vector2d<int>)in_RDI[9];
    local_38.LowerRightCorner = *(vector2d<int> *)(in_RDI + 9);
    local_38.UpperLeftCorner.Y = (int)((ulong)in_RDI[8] >> 0x20);
    local_38.UpperLeftCorner.X = (int)in_RDI[8];
    local_38.UpperLeftCorner.Y = local_38.UpperLeftCorner.Y + 1;
    local_38.UpperLeftCorner.X = local_38.UpperLeftCorner.X + 1;
    uVar6 = (**(code **)(*(long *)in_RDI[0x30] + 0x68))();
    if ((uVar6 & 1) != 0) {
      local_48 = IGUIElement::getRelativePosition((IGUIElement *)in_RDI[0x30]);
      iVar3 = core::rect<int>::getWidth(&local_48);
      local_38.LowerRightCorner.X = local_38.LowerRightCorner.X - iVar3;
    }
    local_38.LowerRightCorner.Y = local_38.LowerRightCorner.Y + -1;
    core::rect<int>::clipAgainst(&local_38,(rect<int> *)(in_RDI + 10));
    plVar8 = local_10;
    local_4c = (**(code **)*local_10)(local_10,3);
    c = (rect<int> *)(in_RDI + 10);
    (**(code **)(*plVar8 + 0x70))
              (plVar8,in_RDI,local_4c,1,*(byte *)((long)in_RDI + 0x1b1) & 1,&local_28);
    if (local_18 != (rect<int> *)0x0) {
      core::rect<int>::clipAgainst(&local_38,local_18);
    }
    local_20 = (vector2d<int>)in_RDI[9];
    local_28._0_4_ = (int)in_RDI[8];
    local_28._4_4_ = (int)((ulong)in_RDI[8] >> 0x20);
    local_28 = CONCAT44(local_28._4_4_,(int)local_28 + 1);
    uVar6 = (**(code **)(*(long *)in_RDI[0x30] + 0x68))();
    if ((uVar6 & 1) != 0) {
      local_5c = IGUIElement::getRelativePosition((IGUIElement *)in_RDI[0x30]);
      iVar3 = core::rect<int>::getWidth(&local_5c);
      local_20.Y = 0;
      local_20.X = local_20.X - iVar3;
    }
    local_20.Y = *(int *)((long)in_RDI + 0x44) + *(int *)((long)in_RDI + 0x15c);
    iVar3 = (**(code **)(*(long *)in_RDI[0x30] + 0x160))();
    local_28._4_4_ = local_28._4_4_ - iVar3;
    iVar3 = (**(code **)(*(long *)in_RDI[0x30] + 0x160))();
    local_20.Y = local_20.Y - iVar3;
    local_e9 = 1;
    if ((*(byte *)((long)in_RDI + 0x1b4) & 1) == 0) {
      bVar2 = (**(code **)(*(long *)in_RDI[0x25] + 0x28))((long *)in_RDI[0x25],in_RDI,0);
      local_e9 = 1;
      if ((bVar2 & 1) == 0) {
        local_e9 = (**(code **)(*(long *)in_RDI[0x25] + 0x28))((long *)in_RDI[0x25],in_RDI[0x30],0);
      }
    }
    local_5d = local_e9 & 1;
    for (local_64 = 0; iVar3 = local_64,
        uVar4 = core::array<irr::gui::CGUIListBox::ListItem>::size
                          ((array<irr::gui::CGUIListBox::ListItem> *)0x3c25c2), plVar8 = local_10,
        iVar3 < (int)uVar4; local_64 = local_64 + 1) {
      if ((*(int *)((long)in_RDI + 0x44) <= local_20.Y) &&
         (local_28._4_4_ <= *(int *)((long)in_RDI + 0x4c))) {
        if ((local_64 == (int)in_RDI[0x2b]) && ((local_5d & 1) != 0)) {
          local_68 = (**(code **)*local_10)(local_10,10);
          (**(code **)(*plVar8 + 0xa8))(plVar8,in_RDI,&local_68,&local_28,&local_38);
        }
        local_78.LowerRightCorner = local_20;
        local_78.UpperLeftCorner.Y = local_28._4_4_;
        local_78.UpperLeftCorner.X = (int)local_28 + 3;
        if (in_RDI[0x2e] != 0) {
          if ((in_RDI[0x2f] != 0) &&
             (pLVar7 = core::array<irr::gui::CGUIListBox::ListItem>::operator[]
                                 ((array<irr::gui::CGUIListBox::ListItem> *)
                                  CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0),
                                  (u32)((ulong)c >> 0x20)), -1 < pLVar7->Icon)) {
            local_80 = local_78.UpperLeftCorner;
            iVar3 = core::rect<int>::getHeight(&local_78);
            local_80.Y = iVar3 / 2 + local_80.Y;
            local_80.X = (int)in_RDI[0x2d] / 2 + local_80.X;
            uVar4 = (u32)((ulong)c >> 0x20);
            if ((local_64 == (int)in_RDI[0x2b]) && ((local_5d & 1) != 0)) {
              plVar8 = (long *)in_RDI[0x2f];
              pLVar7 = core::array<irr::gui::CGUIListBox::ListItem>::operator[]
                                 ((array<irr::gui::CGUIListBox::ListItem> *)
                                  CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0),
                                  uVar4);
              sVar9 = pLVar7->Icon;
              uVar6 = (**(code **)(*in_RDI + 0x1b0))(in_RDI,local_64,3);
              if ((uVar6 & 1) == 0) {
                local_84 = (**(code **)(*in_RDI + 0x1c0))(in_RDI,3);
              }
              else {
                local_84 = (**(code **)(*in_RDI + 0x1b8))(in_RDI,local_64,3);
              }
              uVar10 = (undefined4)in_RDI[0x31];
              uVar5 = os::Timer::getTime();
              c = (rect<int> *)CONCAT44(uVar4,uVar5);
              in_stack_fffffffffffffec0 = 0;
              (**(code **)(*plVar8 + 0x40))(plVar8,sVar9,&local_80,&local_38,&local_84,uVar10,c,0,1)
              ;
            }
            else {
              plVar8 = (long *)in_RDI[0x2f];
              pLVar7 = core::array<irr::gui::CGUIListBox::ListItem>::operator[]
                                 ((array<irr::gui::CGUIListBox::ListItem> *)
                                  CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0),
                                  uVar4);
              sVar9 = pLVar7->Icon;
              uVar6 = (**(code **)(*in_RDI + 0x1b0))(in_RDI,local_64,2);
              if ((uVar6 & 1) == 0) {
                local_88 = (**(code **)(*in_RDI + 0x1c0))(in_RDI,2);
              }
              else {
                local_88 = (**(code **)(*in_RDI + 0x1b8))(in_RDI,local_64,2);
              }
              if (local_64 == (int)in_RDI[0x2b]) {
                in_stack_fffffffffffffee4 = os::Timer::getTime();
              }
              else {
                in_stack_fffffffffffffee4 = 0;
              }
              c = (rect<int> *)CONCAT44(uVar4,in_stack_fffffffffffffee4);
              in_stack_fffffffffffffec0 = 0;
              (**(code **)(*plVar8 + 0x40))(plVar8,sVar9,&local_80,&local_38,&local_88,0,c,0,1);
            }
          }
          local_78.UpperLeftCorner.X = (int)in_RDI[0x2d] + 3 + local_78.UpperLeftCorner.X;
          uVar4 = (u32)((ulong)c >> 0x20);
          if ((local_64 == (int)in_RDI[0x2b]) && ((local_5d & 1) != 0)) {
            puVar1 = (undefined8 *)in_RDI[0x2e];
            core::array<irr::gui::CGUIListBox::ListItem>::operator[]
                      ((array<irr::gui::CGUIListBox::ListItem> *)
                       CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0),uVar4);
            core::string<wchar_t>::c_str((string<wchar_t> *)0x3c299b);
            core::string<wchar_t>::string<wchar_t>
                      ((string<wchar_t> *)
                       CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0),(wchar_t *)c);
            uVar6 = (**(code **)(*in_RDI + 0x1b0))(in_RDI,local_64,1);
            if ((uVar6 & 1) == 0) {
              local_ac = (**(code **)(*in_RDI + 0x1c0))(in_RDI,1);
            }
            else {
              local_ac = (**(code **)(*in_RDI + 0x1b8))(in_RDI,local_64,1);
            }
            c = &local_38;
            (**(code **)*puVar1)(puVar1,local_a8,&local_78,local_ac);
            core::string<wchar_t>::~string((string<wchar_t> *)0x3c2a4b);
          }
          else {
            puVar1 = (undefined8 *)in_RDI[0x2e];
            core::array<irr::gui::CGUIListBox::ListItem>::operator[]
                      ((array<irr::gui::CGUIListBox::ListItem> *)
                       CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0),uVar4);
            core::string<wchar_t>::c_str((string<wchar_t> *)0x3c2a7c);
            core::string<wchar_t>::string<wchar_t>
                      ((string<wchar_t> *)
                       CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0),(wchar_t *)c);
            uVar6 = (**(code **)(*in_RDI + 0x1b0))(in_RDI,local_64,0);
            if ((uVar6 & 1) == 0) {
              local_d4 = (**(code **)(*in_RDI + 0x1c0))(in_RDI,0);
            }
            else {
              local_d4 = (**(code **)(*in_RDI + 0x1b8))(in_RDI,local_64,0);
            }
            c = &local_38;
            (**(code **)*puVar1)(puVar1,local_d0,&local_78,local_d4,0);
            core::string<wchar_t>::~string((string<wchar_t> *)0x3c2b11);
          }
          local_78.UpperLeftCorner.X = local_78.UpperLeftCorner.X - ((int)in_RDI[0x2d] + 3);
        }
      }
      local_28._4_4_ = *(int *)((long)in_RDI + 0x15c) + local_28._4_4_;
      local_20.Y = *(int *)((long)in_RDI + 0x15c) + local_20.Y;
    }
    IGUIElement::draw((IGUIElement *)CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0));
  }
  return;
}

Assistant:

void CGUIListBox::draw()
{
	if (!IsVisible)
		return;

	recalculateItemHeight(); // if the font changed

	IGUISkin *skin = Environment->getSkin();
	updateScrollBarSize(skin->getSize(EGDS_SCROLLBAR_SIZE));

	core::rect<s32> *clipRect = 0;

	// draw background
	core::rect<s32> frameRect(AbsoluteRect);

	// draw items

	core::rect<s32> clientClip(AbsoluteRect);
	clientClip.UpperLeftCorner.Y += 1;
	clientClip.UpperLeftCorner.X += 1;
	if (ScrollBar->isVisible())
		clientClip.LowerRightCorner.X -= ScrollBar->getRelativePosition().getWidth();
	clientClip.LowerRightCorner.Y -= 1;
	clientClip.clipAgainst(AbsoluteClippingRect);

	skin->draw3DSunkenPane(this, skin->getColor(EGDC_3D_HIGH_LIGHT), true,
			DrawBack, frameRect, &AbsoluteClippingRect);

	if (clipRect)
		clientClip.clipAgainst(*clipRect);

	frameRect = AbsoluteRect;
	frameRect.UpperLeftCorner.X += 1;
	if (ScrollBar->isVisible())
		frameRect.LowerRightCorner.X -= ScrollBar->getRelativePosition().getWidth();

	frameRect.LowerRightCorner.Y = AbsoluteRect.UpperLeftCorner.Y + ItemHeight;

	frameRect.UpperLeftCorner.Y -= ScrollBar->getPos();
	frameRect.LowerRightCorner.Y -= ScrollBar->getPos();

	bool hl = (HighlightWhenNotFocused || Environment->hasFocus(this) || Environment->hasFocus(ScrollBar));

	for (s32 i = 0; i < (s32)Items.size(); ++i) {
		if (frameRect.LowerRightCorner.Y >= AbsoluteRect.UpperLeftCorner.Y &&
				frameRect.UpperLeftCorner.Y <= AbsoluteRect.LowerRightCorner.Y) {
			if (i == Selected && hl)
				skin->draw2DRectangle(this, skin->getColor(EGDC_HIGH_LIGHT), frameRect, &clientClip);

			core::rect<s32> textRect = frameRect;
			textRect.UpperLeftCorner.X += 3;

			if (Font) {
				if (IconBank && (Items[i].Icon > -1)) {
					core::position2di iconPos = textRect.UpperLeftCorner;
					iconPos.Y += textRect.getHeight() / 2;
					iconPos.X += ItemsIconWidth / 2;

					if (i == Selected && hl) {
						IconBank->draw2DSprite((u32)Items[i].Icon, iconPos, &clientClip,
								hasItemOverrideColor(i, EGUI_LBC_ICON_HIGHLIGHT) ? getItemOverrideColor(i, EGUI_LBC_ICON_HIGHLIGHT) : getItemDefaultColor(EGUI_LBC_ICON_HIGHLIGHT),
								selectTime, os::Timer::getTime(), false, true);
					} else {
						IconBank->draw2DSprite((u32)Items[i].Icon, iconPos, &clientClip,
								hasItemOverrideColor(i, EGUI_LBC_ICON) ? getItemOverrideColor(i, EGUI_LBC_ICON) : getItemDefaultColor(EGUI_LBC_ICON),
								0, (i == Selected) ? os::Timer::getTime() : 0, false, true);
					}
				}

				textRect.UpperLeftCorner.X += ItemsIconWidth + 3;

				if (i == Selected && hl) {
					Font->draw(Items[i].Text.c_str(), textRect,
							hasItemOverrideColor(i, EGUI_LBC_TEXT_HIGHLIGHT) ? getItemOverrideColor(i, EGUI_LBC_TEXT_HIGHLIGHT) : getItemDefaultColor(EGUI_LBC_TEXT_HIGHLIGHT),
							false, true, &clientClip);
				} else {
					Font->draw(Items[i].Text.c_str(), textRect,
							hasItemOverrideColor(i, EGUI_LBC_TEXT) ? getItemOverrideColor(i, EGUI_LBC_TEXT) : getItemDefaultColor(EGUI_LBC_TEXT),
							false, true, &clientClip);
				}

				textRect.UpperLeftCorner.X -= ItemsIconWidth + 3;
			}
		}

		frameRect.UpperLeftCorner.Y += ItemHeight;
		frameRect.LowerRightCorner.Y += ItemHeight;
	}

	IGUIElement::draw();
}